

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

String * cxxopts::(anonymous_namespace)::format_description_abi_cxx11_
                   (HelpOptionDetails *o,size_t start,size_t allowed,bool tab_expansion)

{
  bool bVar1;
  ulong uVar2;
  char (*pacVar3) [15];
  iterator begin;
  iterator end;
  reference pcVar4;
  ulong in_RCX;
  long in_RSI;
  String *in_RDI;
  byte in_R8B;
  bool onlyWhiteSpace;
  bool appendNewLine;
  size_t size;
  iterator lastSpace;
  iterator startLine;
  iterator previous;
  iterator current;
  size_t skip;
  iterator c;
  size_t size_1;
  String desc2;
  String desc;
  String *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  String *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  String *__lhs;
  undefined1 local_169 [33];
  char *local_148;
  char *local_140;
  char *local_138;
  byte local_12a;
  byte local_129;
  ulong local_128;
  char *local_120;
  char *local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  long local_100;
  char *local_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  long local_e8;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [39];
  byte local_21;
  ulong local_20;
  long local_10;
  
  local_21 = in_R8B & 1;
  __lhs = in_RDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_48,(string *)(in_RSI + 0x38));
  if (((*(byte *)(local_10 + 0x58) & 1) != 0) &&
     (((*(byte *)(local_10 + 0xc9) & 1) == 0 ||
      (in_stack_fffffffffffffe5f =
            std::operator!=(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18),
      (bool)in_stack_fffffffffffffe5f)))) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((char *)__lhs,in_RDI);
      std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
      in_stack_fffffffffffffe50 = local_78;
      toLocalString<std::__cxx11::string>(in_stack_fffffffffffffe18);
      std::__cxx11::string::operator+=(local_48,in_stack_fffffffffffffe50);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
    }
    else {
      pacVar3 = const((char (*) [15])" (default: \"\")");
      std::__cxx11::string::operator+=(local_48,*pacVar3);
    }
  }
  local_b9 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  if ((local_21 & 1) != 0) {
    std::__cxx11::string::string(local_e0);
    local_e8 = 0;
    local_f0._M_current = (char *)std::begin<std::__cxx11::string>(in_stack_fffffffffffffe18);
    while( true ) {
      local_f8 = (char *)std::end<std::__cxx11::string>(in_stack_fffffffffffffe18);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe20,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe18);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_f0);
      if (*pcVar4 == '\n') {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_f0);
        std::__cxx11::string::operator+=(local_e0,*pcVar4);
        local_e8 = 0;
      }
      else {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_f0);
        if (*pcVar4 == '\t') {
          local_100 = 8 - (ulong)((uint)local_e8 & 7);
          stringAppend(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18,'\0');
          local_e8 = local_100 + local_e8;
        }
        else {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_f0);
          std::__cxx11::string::operator+=(local_e0,*pcVar4);
          local_e8 = local_e8 + 1;
        }
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_f0);
    }
    std::__cxx11::string::operator=(local_48,local_e0);
    std::__cxx11::string::~string(local_e0);
  }
  std::__cxx11::string::operator+=(local_48," ");
  begin = std::begin<std::__cxx11::string>(in_stack_fffffffffffffe18);
  local_128 = 0;
  local_12a = 1;
  local_120 = begin._M_current;
  local_118 = begin._M_current;
  local_110._M_current = begin._M_current;
  local_108._M_current = begin._M_current;
  while( true ) {
    end = std::end<std::__cxx11::string>(in_stack_fffffffffffffe18);
    local_138 = end._M_current;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffe20,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffe18);
    if (!bVar1) break;
    local_129 = 0;
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_110);
    if ((*pcVar4 == ' ') ||
       (pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_110), *pcVar4 == '\t')) {
      local_120 = local_108._M_current;
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_108);
    if ((*pcVar4 != ' ') &&
       (pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_108), *pcVar4 != '\t')) {
      local_12a = 0;
    }
    while (pcVar4 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_108), *pcVar4 == '\n') {
      local_110._M_current = local_108._M_current;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_108);
      local_129 = 1;
    }
    if (((local_129 & 1) == 0) && (local_20 <= local_128)) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe20,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe18);
      if (bVar1) {
        local_108._M_current = local_120;
        local_110._M_current = local_120;
      }
      local_129 = 1;
    }
    if ((local_129 & 1) != 0) {
      local_140 = local_118;
      local_148 = local_108._M_current;
      stringAppend<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (in_stack_fffffffffffffe20,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )begin._M_current,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )end._M_current);
      local_118 = local_108._M_current;
      local_120 = local_108._M_current;
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_110);
      if (*pcVar4 != '\n') {
        in_stack_fffffffffffffe20 = (String *)local_169;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_RDI,(char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                   (allocator<char> *)in_stack_fffffffffffffe50);
        stringAppend(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        std::__cxx11::string::~string((string *)(local_169 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_169);
      }
      stringAppend(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18,'\0');
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_110);
      if (*pcVar4 != '\n') {
        stringAppend<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (in_stack_fffffffffffffe20,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )begin._M_current,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )end._M_current);
      }
      local_12a = 1;
      local_128 = 0;
    }
    local_110._M_current = local_108._M_current;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_108);
    local_128 = local_128 + 1;
  }
  if ((local_12a & 1) == 0) {
    stringAppend<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (in_stack_fffffffffffffe20,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )begin._M_current,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )end._M_current);
  }
  local_b9 = 1;
  std::__cxx11::string::~string(local_48);
  return __lhs;
}

Assistant:

String
format_description
(
  const HelpOptionDetails& o,
  std::size_t start,
  std::size_t allowed,
  bool tab_expansion
)
{
  auto desc = o.desc;

  if (o.has_default && (!o.is_boolean || o.default_value != "false"))
  {
    if(!o.default_value.empty())
    {
      desc += toLocalString(" (default: " + o.default_value + ")");
    }
    else
    {
      desc += toLocalString(" (default: \"\")");
    }
  }

  String result;

  if (tab_expansion)
  {
    String desc2;
    auto size = std::size_t{ 0 };
    for (auto c = std::begin(desc); c != std::end(desc); ++c)
    {
      if (*c == '\n')
      {
        desc2 += *c;
        size = 0;
      }
      else if (*c == '\t')
      {
        auto skip = 8 - size % 8;
        stringAppend(desc2, skip, ' ');
        size += skip;
      }
      else
      {
        desc2 += *c;
        ++size;
      }
    }
    desc = desc2;
  }

  desc += " ";

  auto current = std::begin(desc);
  auto previous = current;
  auto startLine = current;
  auto lastSpace = current;

  auto size = std::size_t{};

  bool appendNewLine;
  bool onlyWhiteSpace = true;

  while (current != std::end(desc))
  {
    appendNewLine = false;
    if (*previous == ' ' || *previous == '\t')
    {
      lastSpace = current;
    }
    if (*current != ' ' && *current != '\t')
    {
      onlyWhiteSpace = false;
    }

    while (*current == '\n')
    {
      previous = current;
      ++current;
      appendNewLine = true;
    }

    if (!appendNewLine && size >= allowed)
    {
      if (lastSpace != startLine)
      {
        current = lastSpace;
        previous = current;
      }
      appendNewLine = true;
    }

    if (appendNewLine)
    {
      stringAppend(result, startLine, current);
      startLine = current;
      lastSpace = current;

      if (*previous != '\n')
      {
        stringAppend(result, "\n");
      }

      stringAppend(result, start, ' ');

      if (*previous != '\n')
      {
        stringAppend(result, lastSpace, current);
      }

      onlyWhiteSpace = true;
      size = 0;
    }

    previous = current;
    ++current;
    ++size;
  }

  //append whatever is left but ignore whitespace
  if (!onlyWhiteSpace)
  {
    stringAppend(result, startLine, previous);
  }

  return result;
}